

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::eliminate_(SimpSolver *this)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  int *piVar5;
  uint *puVar6;
  uint *puVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  rusage ru;
  rusage local_c0;
  
  getrusage(RUSAGE_SELF,&local_c0);
  dVar17 = (double)local_c0.ru_utime.tv_sec;
  dVar18 = (double)local_c0.ru_utime.tv_usec;
  bVar8 = Solver::simplify(&this->super_Solver);
  if (!bVar8) {
    return false;
  }
  if (this->use_simplification != true) {
    return true;
  }
  iVar12 = (this->super_Solver).trail.sz;
  do {
    if ((((this->n_touched < 1) && ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) &&
        ((this->elim_heap).heap.sz < 1)) ||
       ((this->max_simp_steps != 0xffffffffffffffff &&
        ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps))))
    goto LAB_00129ae4;
    gatherTouchedClauses(this);
    iVar10 = (this->subsumption_queue).end;
    iVar14 = 0;
    iVar11 = (this->subsumption_queue).first;
    iVar9 = iVar10 - iVar11;
    if (iVar10 < iVar11) {
      iVar14 = (this->subsumption_queue).buf.sz;
    }
    iVar10 = iVar9 + iVar14;
    if (((iVar10 != 0 && SCARRY4(iVar9,iVar14) == iVar10 < 0) ||
        (this->bwdsub_assigns < (this->super_Solver).trail.sz)) &&
       (bVar8 = backwardSubsumptionCheck(this,true), !bVar8)) {
LAB_00129acc:
      (this->super_Solver).ok = false;
      goto LAB_00129ae4;
    }
    if (((this->super_Solver).asynch_interrupt != false) ||
       ((this->max_simp_steps != 0xffffffffffffffff &&
        ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps)))) break;
    if ((this->elim_heap).heap.sz != 0) {
      iVar10 = 0;
      uVar16 = 0;
      do {
        iVar11 = Heap<Minisat::SimpSolver::ElimLt>::removeMin(&this->elim_heap);
        if (((this->super_Solver).asynch_interrupt != false) ||
           ((this->max_simp_steps != 0xffffffffffffffff &&
            ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps)))) break;
        if (((this->eliminated).data[iVar11] == '\0') &&
           (((this->super_Solver).assigns.data[iVar11].value & 2) != 0)) {
          if ((1 < (this->super_Solver).verbosity) && ((int)(uVar16 / 100) * 100 + iVar10 == 0)) {
            printf("c elimination left: %10d\r",(ulong)(uint)(this->elim_heap).heap.sz);
          }
          if (this->use_asymm == true) {
            pcVar3 = (this->frozen).data;
            cVar1 = pcVar3[iVar11];
            pcVar3[iVar11] = '\x01';
            bVar8 = asymmVar(this,iVar11);
            if (!bVar8) goto LAB_00129acc;
            (this->frozen).data[iVar11] = cVar1 != '\0';
          }
          if ((((this->use_elim == true) &&
               (((this->super_Solver).assigns.data[iVar11].value & 2) != 0)) &&
              ((this->frozen).data[iVar11] == '\0')) && (bVar8 = eliminateVar(this,iVar11), !bVar8))
          goto LAB_00129acc;
          if ((double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz *
              this->simp_garbage_frac <
              (double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_) {
            (*(this->super_Solver)._vptr_Solver[2])();
          }
        }
        uVar16 = (ulong)((int)uVar16 + 1);
        iVar10 = iVar10 + -1;
      } while ((this->elim_heap).heap.sz != 0);
    }
  } while( true );
  piVar4 = (this->elim_heap).heap.data;
  if ((this->elim_heap).heap.sz < 1) {
    if (piVar4 == (int *)0x0) goto LAB_00129ae4;
  }
  else {
    piVar5 = (this->elim_heap).indices.data;
    lVar15 = 0;
    do {
      piVar5[piVar4[lVar15]] = -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->elim_heap).heap.sz);
  }
  (this->elim_heap).heap.sz = 0;
LAB_00129ae4:
  if (iVar12 == (this->super_Solver).trail.sz) {
    iVar12 = (this->super_Solver).clauses.sz;
    if (0 < iVar12) {
      puVar6 = (this->super_Solver).clauses.data;
      puVar7 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      lVar15 = 0;
      iVar10 = 0;
      do {
        uVar2 = puVar6[lVar15];
        if ((puVar7[uVar2] & 3) == 0) {
          lVar13 = (long)iVar10;
          iVar10 = iVar10 + 1;
          puVar6[lVar13] = uVar2;
          iVar12 = (this->super_Solver).clauses.sz;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar12);
      if (0 < (int)lVar15 - iVar10) {
        (this->super_Solver).clauses.sz = (iVar12 + iVar10) - (int)lVar15;
      }
    }
  }
  else {
    removeSatisfied(this);
  }
  if ((double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz *
      (this->super_Solver).garbage_frac <
      (double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_) {
    (*(this->super_Solver)._vptr_Solver[2])();
  }
  if ((0 < (this->super_Solver).verbosity) && (lVar15 = (long)(this->elimclauses).sz, 0 < lVar15)) {
    printf("c |  Eliminated clauses:     %10.2f Mb                                      |\n",
           (double)(lVar15 << 2) * 9.5367431640625e-07);
  }
  getrusage(RUSAGE_SELF,&local_c0);
  (this->super_Solver).statistics.simpSeconds =
       (((double)local_c0.ru_utime.tv_usec / 1000000.0 + (double)local_c0.ru_utime.tv_sec) -
       (dVar18 / 1000000.0 + dVar17)) + (this->super_Solver).statistics.simpSeconds;
  return (this->super_Solver).ok;
}

Assistant:

bool SimpSolver::eliminate_()
{
    double simp_time = cpuTime();
    if (!simplify())
        return false;
    else if (!use_simplification)
        return true;

    int trail_size_last = trail.size();

    // Main simplification loop:
    //
    while (n_touched > 0 || bwdsub_assigns < trail.size() || elim_heap.size() > 0) {

        if (!isInSimpLimit()) break;

        gatherTouchedClauses();
        // printf("  ## (time = %6.2f s) BWD-SUB: queue = %d, trail = %d\n", cpuTime(), subsumption_queue.size(), trail.size() - bwdsub_assigns);
        if ((subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) && !backwardSubsumptionCheck(true)) {
            ok = false;
            goto cleanup;
        }

        // Empty elim_heap and return immediately on user-interrupt:
        if (asynch_interrupt || !isInSimpLimit()) {
            assert(bwdsub_assigns == trail.size());
            assert(subsumption_queue.size() == 0);
            assert(n_touched == 0);
            elim_heap.clear();
            goto cleanup;
        }

        // printf("  ## (time = %6.2f s) ELIM: vars = %d\n", cpuTime(), elim_heap.size());
        for (int cnt = 0; !elim_heap.empty(); cnt++) {
            Var elim = elim_heap.removeMin();

            if (asynch_interrupt || !isInSimpLimit()) break;

            if (isEliminated(elim) || value(elim) != l_Undef) continue;

            if (verbosity >= 2 && cnt % 100 == 0) printf("c elimination left: %10d\r", elim_heap.size());

            if (use_asymm) {
                // Temporarily freeze variable. Otherwise, it would immediately end up on the queue again:
                bool was_frozen = frozen[elim];
                frozen[elim] = true;
                if (!asymmVar(elim)) {
                    ok = false;
                    goto cleanup;
                }
                frozen[elim] = was_frozen;
            }

            // At this point, the variable may have been set by assymetric branching, so check it
            // again. Also, don't eliminate frozen variables:
            if (use_elim && value(elim) == l_Undef && !frozen[elim] && !eliminateVar(elim)) {
                ok = false;
                goto cleanup;
            }

            checkGarbage(simp_garbage_frac);
        }

        assert(subsumption_queue.size() == 0);
    }
cleanup:
    // To get an accurate number of clauses.
    if (trail_size_last != trail.size())
        removeSatisfied();
    else {
        int i, j;
        for (i = j = 0; i < clauses.size(); i++)
            if (ca[clauses[i]].mark() == 0) clauses[j++] = clauses[i];
        clauses.shrink(i - j);
    }
    checkGarbage();

    if (verbosity >= 1 && elimclauses.size() > 0)
        printf("c |  Eliminated clauses:     %10.2f Mb                                      |\n",
               double(elimclauses.size() * sizeof(uint32_t)) / (1024 * 1024));

    statistics.simpSeconds += cpuTime() - simp_time;

    return ok;
}